

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseColGroup(TidyDocImpl *doc,Node *colgroup,GetTokenMode mode)

{
  TidyParserMemory data;
  Bool BVar1;
  Node *node_00;
  code *pcStack_98;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *parent;
  Node *node;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *colgroup_local;
  TidyDocImpl *doc_local;
  
  if (colgroup == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    node._4_4_ = memory.reentry_mode;
  }
  else {
    pNStack_20 = colgroup;
    node._4_4_ = mode;
    if ((colgroup->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  do {
    while( true ) {
      node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
      if (node_00 == (Node *)0x0) {
        return (Node *)0x0;
      }
      if ((node_00->tag == pNStack_20->tag) && (node_00->type == EndTag)) {
        prvTidyFreeNode(doc,node_00);
        pNStack_20->closed = yes;
        return (Node *)0x0;
      }
      if (node_00->type == EndTag) break;
LAB_00140ffb:
      BVar1 = prvTidynodeIsText(node_00);
      if (BVar1 != no) {
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
      BVar1 = InsertMisc(pNStack_20,node_00);
      if (BVar1 == no) {
        if (node_00->tag == (Dict *)0x0) {
          prvTidyReport(doc,pNStack_20,node_00,0x235);
          prvTidyFreeNode(doc,node_00);
        }
        else {
          if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
             (node_00->tag->id != TidyTag_COL)) {
            prvTidyUngetToken(doc);
            return (Node *)0x0;
          }
          if (node_00->type != EndTag) {
            prvTidyInsertNodeAtEnd(pNStack_20,node_00);
            memset(&pcStack_98,0,0x30);
            pcStack_98 = prvTidyParseColGroup;
            memory_1.identity = (Parser *)pNStack_20;
            memory_1.reentry_mode = node._4_4_;
            data.register_1 = memory_1.reentry_state;
            data.mode = node._4_4_;
            data.original_node = pNStack_20;
            data.identity = prvTidyParseColGroup;
            data.reentry_node = node_00;
            data._24_8_ = memory_1.reentry_node;
            data.register_2 = memory_1.mode;
            data._44_4_ = memory_1.register_1;
            memory_1.original_node = node_00;
            prvTidypushMemory(doc,data);
            return node_00;
          }
          prvTidyReport(doc,pNStack_20,node_00,0x235);
          prvTidyFreeNode(doc,node_00);
        }
      }
    }
    if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
       (node_00->tag->id != TidyTag_FORM)) {
      for (memory._40_8_ = pNStack_20->parent; memory._40_8_ != 0;
          memory._40_8_ = *(undefined8 *)memory._40_8_) {
        if (node_00->tag == *(Dict **)(memory._40_8_ + 0x38)) {
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
      }
      goto LAB_00140ffb;
    }
    BadForm(doc);
    prvTidyReport(doc,pNStack_20,node_00,0x235);
    prvTidyFreeNode(doc,node_00);
  } while( true );
}

Assistant:

Node* TY_(ParseColGroup)( TidyDocImpl* doc, Node *colgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node, *parent;
    DEBUG_LOG_COUNTERS;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( colgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        colgroup = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(colgroup);
        if (colgroup->tag->model & CM_EMPTY)
            return NULL;
    }

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);

        if (node->tag == colgroup->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            colgroup->closed = yes;
            return NULL;
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = colgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(colgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsCOL(node) )
        {
            TY_(UngetToken)( doc );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, colgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* node should be <COL> */
        TY_(InsertNodeAtEnd)(colgroup, node);
        
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseColGroup);
            memory.original_node = colgroup;
            memory.reentry_node = node;
            memory.mode = mode;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
        }
        DEBUG_LOG_EXIT;
        return node;
    }
    DEBUG_LOG_EXIT;
    return NULL;
}